

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_struct.h
# Opt level: O2

void __thiscall t_struct::t_struct(t_struct *this,t_program *program)

{
  t_type::t_type(&this->super_t_type,program);
  (this->super_t_type).super_t_doc._vptr_t_doc = (_func_int **)&PTR__t_struct_00365d98;
  this->members_with_value = 0;
  this->xsd_all_ = false;
  (this->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)
   ((long)&(this->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 7) = 0;
  return;
}

Assistant:

t_struct(t_program* program)
    : t_type(program),
      is_xception_(false),
      is_union_(false),
      members_validated(false),
      members_with_value(0),
      xsd_all_(false) {}